

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O2

void cm::anon_unknown_0::write_req_cb(uv_write_t *req,int status)

{
  unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
  self;
  shared_ptr<std::function<void_(int)>_> cb;
  _Head_base<0UL,_cm::(anonymous_namespace)::write_req_*,_false> local_28;
  __shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28._M_head_impl = (write_req *)req;
  std::__shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,req + 1);
  if (local_20._M_ptr != (function<void_(int)> *)0x0) {
    std::function<void_(int)>::operator()(local_20._M_ptr,status);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::
  unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
  ::~unique_ptr((unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
                 *)&local_28);
  return;
}

Assistant:

void write_req_cb(uv_write_t* req, int status)
{
  // Ownership has been transferred from the event loop.
  std::unique_ptr<write_req> self(static_cast<write_req*>(req));

  // Notify the original uv_write caller if it is still interested.
  if (auto cb = self->cb_.lock()) {
    (*cb)(status);
  }
}